

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int pagerWriteLargeSector(PgHdr *pPg)

{
  u32 i;
  uint uVar1;
  uint uVar2;
  Pager *pPager;
  int iVar3;
  DbPage *pPg_00;
  int iVar4;
  uint uVar5;
  Pgno pgno;
  int iVar6;
  bool bVar7;
  PgHdr *pPage;
  PgHdr *local_38;
  
  pPager = pPg->pPager;
  uVar1 = pPager->dbSize;
  pPager->doNotSpill = pPager->doNotSpill | 4;
  uVar2 = pPg->pgno;
  iVar3 = SUB164(ZEXT416(pPager->sectorSize) / SEXT816(pPager->pageSize),0);
  uVar5 = -iVar3 & uVar2 - 1;
  if (uVar1 < uVar2) {
    iVar4 = uVar2 - uVar5;
  }
  else {
    iVar4 = uVar1 - uVar5;
    if (uVar5 + iVar3 <= uVar1) {
      iVar4 = iVar3;
    }
  }
  pgno = uVar5 + 1;
  bVar7 = false;
  iVar6 = 0;
  iVar3 = 0;
  local_38 = pPg;
  do {
    if ((iVar4 <= iVar6) || (iVar3 != 0)) {
      if ((iVar3 == 0) && (bVar7)) {
        iVar6 = 0;
        if (0 < iVar4) {
          iVar6 = iVar4;
        }
        while (bVar7 = iVar6 != 0, iVar6 = iVar6 + -1, bVar7) {
          pPg_00 = sqlite3PagerLookup(pPager,pgno);
          if (pPg_00 != (DbPage *)0x0) {
            *(byte *)&pPg_00->flags = (byte)pPg_00->flags | 8;
            sqlite3PagerUnrefNotNull(pPg_00);
          }
          pgno = pgno + 1;
        }
      }
      pPager->doNotSpill = pPager->doNotSpill & 0xfb;
      return iVar3;
    }
    i = pgno + iVar6;
    if ((i == local_38->pgno) || (iVar3 = sqlite3BitvecTest(pPager->pInJournal,i), iVar3 == 0)) {
      iVar3 = 0;
      if ((i != pPager->lckPgno) && (iVar3 = (*pPager->xGet)(pPager,i,&pPage,0), iVar3 == 0)) {
        iVar3 = pager_write(pPage);
        if ((pPage->flags & 8) != 0) {
          bVar7 = true;
        }
        goto LAB_00139e15;
      }
    }
    else {
      pPage = sqlite3PagerLookup(pPager,i);
      iVar3 = 0;
      if (pPage != (DbPage *)0x0) {
        if ((pPage->flags & 8) != 0) {
          bVar7 = true;
        }
LAB_00139e15:
        sqlite3PagerUnrefNotNull(pPage);
      }
    }
    iVar6 = iVar6 + 1;
  } while( true );
}

Assistant:

static SQLITE_NOINLINE int pagerWriteLargeSector(PgHdr *pPg){
  int rc = SQLITE_OK;          /* Return code */
  Pgno nPageCount;             /* Total number of pages in database file */
  Pgno pg1;                    /* First page of the sector pPg is located on. */
  int nPage = 0;               /* Number of pages starting at pg1 to journal */
  int ii;                      /* Loop counter */
  int needSync = 0;            /* True if any page has PGHDR_NEED_SYNC */
  Pager *pPager = pPg->pPager; /* The pager that owns pPg */
  Pgno nPagePerSector = (pPager->sectorSize/pPager->pageSize);

  /* Set the doNotSpill NOSYNC bit to 1. This is because we cannot allow
  ** a journal header to be written between the pages journaled by
  ** this function.
  */
  assert( !MEMDB );
  assert( (pPager->doNotSpill & SPILLFLAG_NOSYNC)==0 );
  pPager->doNotSpill |= SPILLFLAG_NOSYNC;

  /* This trick assumes that both the page-size and sector-size are
  ** an integer power of 2. It sets variable pg1 to the identifier
  ** of the first page of the sector pPg is located on.
  */
  pg1 = ((pPg->pgno-1) & ~(nPagePerSector-1)) + 1;

  nPageCount = pPager->dbSize;
  if( pPg->pgno>nPageCount ){
    nPage = (pPg->pgno - pg1)+1;
  }else if( (pg1+nPagePerSector-1)>nPageCount ){
    nPage = nPageCount+1-pg1;
  }else{
    nPage = nPagePerSector;
  }
  assert(nPage>0);
  assert(pg1<=pPg->pgno);
  assert((pg1+nPage)>pPg->pgno);

  for(ii=0; ii<nPage && rc==SQLITE_OK; ii++){
    Pgno pg = pg1+ii;
    PgHdr *pPage;
    if( pg==pPg->pgno || !sqlite3BitvecTest(pPager->pInJournal, pg) ){
      if( pg!=PAGER_SJ_PGNO(pPager) ){
        rc = sqlite3PagerGet(pPager, pg, &pPage, 0);
        if( rc==SQLITE_OK ){
          rc = pager_write(pPage);
          if( pPage->flags&PGHDR_NEED_SYNC ){
            needSync = 1;
          }
          sqlite3PagerUnrefNotNull(pPage);
        }
      }
    }else if( (pPage = sqlite3PagerLookup(pPager, pg))!=0 ){
      if( pPage->flags&PGHDR_NEED_SYNC ){
        needSync = 1;
      }
      sqlite3PagerUnrefNotNull(pPage);
    }
  }

  /* If the PGHDR_NEED_SYNC flag is set for any of the nPage pages
  ** starting at pg1, then it needs to be set for all of them. Because
  ** writing to any of these nPage pages may damage the others, the
  ** journal file must contain sync()ed copies of all of them
  ** before any of them can be written out to the database file.
  */
  if( rc==SQLITE_OK && needSync ){
    assert( !MEMDB );
    for(ii=0; ii<nPage; ii++){
      PgHdr *pPage = sqlite3PagerLookup(pPager, pg1+ii);
      if( pPage ){
        pPage->flags |= PGHDR_NEED_SYNC;
        sqlite3PagerUnrefNotNull(pPage);
      }
    }
  }

  assert( (pPager->doNotSpill & SPILLFLAG_NOSYNC)!=0 );
  pPager->doNotSpill &= ~SPILLFLAG_NOSYNC;
  return rc;
}